

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.c
# Opt level: O0

sptr_t wal_write(sptr_t buf,image_data image,int wal_type)

{
  int wal_type_local;
  sptr_t buf_local;
  
  if (wal_type == 1) {
    join_0x00000010_0x00000000_ = wal_write_q2(buf,&image);
  }
  else if (wal_type == 2) {
    join_0x00000010_0x00000000_ = wal_write_dk(buf,&image);
  }
  else {
    stack0xffffffffffffffe8 = (sptr_t)ZEXT816(0);
  }
  return stack0xffffffffffffffe8;
}

Assistant:

sptr_t wal_write(sptr_t buf, const struct image_data image, int wal_type)
{
	switch (wal_type) {
		case WAL_TYPE_DAIKATANA:
			return wal_write_dk(buf, &image);
		case WAL_TYPE_QUAKE2:
			return wal_write_q2(buf, &image);
		default:
			return SPTR_NULL;
	}
}